

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

NetAliasSymbol * __thiscall
slang::BumpAllocator::emplace<slang::ast::NetAliasSymbol,slang::SourceLocation>
          (BumpAllocator *this,SourceLocation *args)

{
  NetAliasSymbol *pNVar1;
  size_t in_RSI;
  NetAliasSymbol *in_RDI;
  SourceLocation unaff_retaddr;
  size_t in_stack_ffffffffffffffe8;
  
  pNVar1 = (NetAliasSymbol *)allocate((BumpAllocator *)in_RDI,in_RSI,in_stack_ffffffffffffffe8);
  ast::NetAliasSymbol::NetAliasSymbol(in_RDI,unaff_retaddr);
  return pNVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }